

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TSymbolTable::pushThis(TSymbolTable *this,TSymbol *thisSymbol)

{
  int iVar1;
  undefined4 extraout_var;
  TSymbolTableLevel *this_00;
  TSymbol *s;
  TSymbolTableLevel *local_20;
  
  s = thisSymbol;
  iVar1 = (*thisSymbol->_vptr_TSymbol[3])(thisSymbol);
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) == 0) {
    this_00 = (TSymbolTableLevel *)
              TSymbolTableLevel::operator_new((TSymbolTableLevel *)0x68,(size_t)s);
    TSymbolTableLevel::TSymbolTableLevel(this_00);
    local_20 = this_00;
    std::vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>>::
    emplace_back<glslang::TSymbolTableLevel*>
              ((vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>> *)
               this,&local_20);
    updateUniqueIdLevelFlag(this);
    (this->table).
    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>.
    _M_impl.super__Vector_impl_data._M_finish[-1]->thisLevel = true;
    insert(this,thisSymbol);
    return;
  }
  __assert_fail("thisSymbol.getName().size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x2a5,"void glslang::TSymbolTable::pushThis(TSymbol &)");
}

Assistant:

void pushThis(TSymbol& thisSymbol)
    {
        assert(thisSymbol.getName().size() == 0);
        table.push_back(new TSymbolTableLevel);
        updateUniqueIdLevelFlag();
        table.back()->setThisLevel();
        insert(thisSymbol);
    }